

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_codecs.c
# Opt level: O2

cram_codec * cram_beta_decode_init(char *data,int size,cram_external_type option,int version)

{
  byte bVar1;
  cram_codec *__ptr;
  code *pcVar2;
  cram_encoding cVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  cram_encoding cVar7;
  long lStack_30;
  
  __ptr = (cram_codec *)malloc(0x240);
  if (__ptr == (cram_codec *)0x0) {
    return (cram_codec *)0x0;
  }
  __ptr->codec = E_BETA;
  if (option - E_INT < 2) {
    pcVar2 = cram_beta_decode_int;
  }
  else {
    if (1 < option - E_BYTE) {
      abort();
    }
    pcVar2 = cram_beta_decode_char;
  }
  __ptr->decode = pcVar2;
  __ptr->free = cram_beta_decode_free;
  bVar1 = *data;
  cVar3 = (cram_encoding)bVar1;
  lVar6 = 1;
  if (-1 < (char)bVar1) goto LAB_00136f6a;
  cVar7 = (cram_encoding)(byte)data[1];
  uVar5 = (uint)bVar1;
  if (bVar1 < 0xc0) {
    lStack_30 = 2;
    cVar3 = (uVar5 & 0x3f) << 8;
  }
  else {
    if (bVar1 < 0xe0) {
      cVar3 = (uVar5 & 0x1f) << 0x10 | cVar7 << 8 | (uint)(byte)data[2];
      lVar6 = 3;
      goto LAB_00136f6a;
    }
    if (bVar1 < 0xf0) {
      cVar3 = (uVar5 & 0xf) << 0x18 | cVar7 << 0x10 | (uint)(byte)data[2] << 8 | (uint)(byte)data[3]
      ;
      lVar6 = 4;
      goto LAB_00136f6a;
    }
    lStack_30 = 5;
    cVar7 = (uint)(byte)data[3] << 4 | (uint)(byte)data[2] << 0xc | cVar7 << 0x14 | uVar5 << 0x1c;
    cVar3 = (byte)data[4] & (E_GOLOMB_RICE|E_SUBEXP);
  }
  cVar3 = cVar3 | cVar7;
  lVar6 = lStack_30;
LAB_00136f6a:
  (__ptr->field_6).e_byte_array_len.len_encoding = cVar3;
  bVar1 = data[lVar6];
  uVar5 = (uint)bVar1;
  lStack_30 = 1;
  if ((char)bVar1 < '\0') {
    uVar4 = (uint)bVar1;
    uVar5 = (uint)(byte)data[lVar6 + 1];
    if (bVar1 < 0xc0) {
      uVar5 = (uVar4 & 0x3f) << 8 | uVar5;
      lStack_30 = 2;
    }
    else if (bVar1 < 0xe0) {
      uVar5 = (uVar4 & 0x1f) << 0x10 | uVar5 << 8 | (uint)(byte)data[lVar6 + 2];
      lStack_30 = 3;
    }
    else if (bVar1 < 0xf0) {
      uVar5 = (uVar4 & 0xf) << 0x18 | uVar5 << 0x10 | (uint)(byte)data[lVar6 + 2] << 8 |
              (uint)(byte)data[lVar6 + 3];
      lStack_30 = 4;
    }
    else {
      uVar5 = (byte)data[lVar6 + 4] & 0xf |
              (uint)(byte)data[lVar6 + 3] << 4 |
              (uint)(byte)data[lVar6 + 2] << 0xc | uVar5 << 0x14 | uVar4 << 0x1c;
      lStack_30 = 5;
    }
  }
  *(uint *)((long)&__ptr->field_6 + 4) = uVar5;
  if (lStack_30 + lVar6 != (long)size) {
    fwrite("Malformed beta header stream\n",0x1d,1,_stderr);
    free(__ptr);
    return (cram_codec *)0x0;
  }
  return __ptr;
}

Assistant:

cram_codec *cram_beta_decode_init(char *data, int size,
				  enum cram_external_type option,
				  int version) {
    cram_codec *c;
    char *cp = data;

    if (!(c = malloc(sizeof(*c))))
	return NULL;

    c->codec  = E_BETA;
    if (option == E_INT || option == E_LONG)
	c->decode = cram_beta_decode_int;
    else if (option == E_BYTE_ARRAY || option == E_BYTE)
	c->decode = cram_beta_decode_char;
    else
	abort();
    c->free   = cram_beta_decode_free;
    
    cp += itf8_get(cp, &c->beta.offset);
    cp += itf8_get(cp, &c->beta.nbits);

    if (cp - data != size) {
	fprintf(stderr, "Malformed beta header stream\n");
	free(c);
	return NULL;
    }

    return c;
}